

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

unsigned_long
cppforth::Forth::parseUnsignedNumber
          (const_iterator beginIt,const_iterator endIt,const_iterator *it,int numericBase)

{
  Char c_00;
  bool bVar1;
  Cell CVar2;
  Char *pCVar3;
  __unspec local_32;
  type local_31;
  Cell n;
  char c;
  unsigned_long value;
  const_iterator *pcStack_20;
  int numericBase_local;
  const_iterator *it_local;
  const_iterator endIt_local;
  const_iterator beginIt_local;
  
  it->_M_current = (char *)beginIt;
  _n = 0;
  value._4_4_ = numericBase;
  pcStack_20 = it;
  it_local = (const_iterator *)endIt._M_current;
  endIt_local._M_current = beginIt._M_current;
  while( true ) {
    local_31 = (type)__gnu_cxx::operator<=><char_const*,std::__cxx11::string>
                               (pcStack_20,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&it_local);
    std::__cmp_cat::__unspec::__unspec(&local_32,(__unspec *)0x0);
    bVar1 = std::operator<(local_31);
    if (!bVar1) {
      return _n;
    }
    pCVar3 = (Char *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(pcStack_20);
    c_00 = *pCVar3;
    bVar1 = isValidDigit(c_00,value._4_4_);
    if (!bVar1) break;
    CVar2 = digitValue(c_00);
    _n = _n * (long)value._4_4_ + (ulong)CVar2;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(pcStack_20);
  }
  return _n;
}

Assistant:

static unsigned long parseUnsignedNumber(const std::string::const_iterator beginIt, const std::string::const_iterator endIt, 
				std::string::const_iterator &it, int numericBase) {
			it = beginIt;
			unsigned long value=0;
			while (it < endIt) {
				auto c = (*it);
				if (isValidDigit(c, numericBase)) {
					auto n = digitValue(c);
					value = value * numericBase + n;
					++it;
				}
				else {
					break;
				}
			}
			return value;
		}